

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.c
# Opt level: O2

char * dsa_cache_str(ssh_key *key)

{
  strbuf *buf_o;
  char *pcVar1;
  
  buf_o = strbuf_new();
  if (key[-5].vt != (ssh_keyalg *)0x0) {
    append_hex_to_strbuf(buf_o,(mp_int *)key[-5].vt);
    append_hex_to_strbuf(buf_o,(mp_int *)key[-4].vt);
    append_hex_to_strbuf(buf_o,(mp_int *)key[-3].vt);
    append_hex_to_strbuf(buf_o,(mp_int *)key[-2].vt);
    pcVar1 = strbuf_to_str(buf_o);
    return pcVar1;
  }
  strbuf_free(buf_o);
  return (char *)0x0;
}

Assistant:

static char *dsa_cache_str(ssh_key *key)
{
    struct dsa_key *dsa = container_of(key, struct dsa_key, sshk);
    strbuf *sb = strbuf_new();

    if (!dsa->p) {
        strbuf_free(sb);
        return NULL;
    }

    append_hex_to_strbuf(sb, dsa->p);
    append_hex_to_strbuf(sb, dsa->q);
    append_hex_to_strbuf(sb, dsa->g);
    append_hex_to_strbuf(sb, dsa->y);

    return strbuf_to_str(sb);
}